

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

ImageChannelDesc * __thiscall
pbrt::Image::AllChannelsDesc(ImageChannelDesc *__return_storage_ptr__,Image *this)

{
  undefined1 auVar1 [64];
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  int iVar3;
  memory_resource *pmVar4;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  pmVar4 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->offset).alloc.memoryResource = pmVar4;
  (__return_storage_ptr__->offset).ptr = (int *)0x0;
  (__return_storage_ptr__->offset).nAlloc = 0;
  (__return_storage_ptr__->offset).nStored = 0;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
            (&__return_storage_ptr__->offset,(long)(int)(this->channelNames).nStored);
  iVar3 = (int)(this->channelNames).nStored;
  if (0 < iVar3) {
    paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)(__return_storage_ptr__->offset).ptr;
    paVar5 = &(__return_storage_ptr__->offset).field_2;
    if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)0x0) {
      paVar5 = paVar2;
    }
    auVar7 = vpbroadcastq_avx512f();
    auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar10 = vpmovsxbd_avx512f(_DAT_005d5670);
    uVar6 = 0;
    auVar11 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      vpcmpuq_avx512f(auVar9,auVar7,2);
      vpcmpuq_avx512f(auVar8,auVar7,2);
      auVar1 = vmovdqu32_avx512f(auVar10);
      *(undefined1 (*) [64])((long)paVar5 + uVar6 * 4) = auVar1;
      uVar6 = uVar6 + 0x10;
      auVar9 = vpaddq_avx512f(auVar9,auVar11);
      auVar8 = vpaddq_avx512f(auVar8,auVar11);
      auVar10 = vpaddd_avx512f(auVar10,auVar12);
    } while ((iVar3 + 0xfU & 0xfffffff0) != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelDesc AllChannelsDesc() const {
        ImageChannelDesc desc;
        desc.offset.resize(NChannels());
        for (int i = 0; i < NChannels(); ++i)
            desc.offset[i] = i;
        return desc;
    }